

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseDispatch<QVariant>::
     call<QtPromise::QPromiseResolve<QVariant>,QtPromise::QPromiseReject<QVariant>,std::function<QVariant(int_const&)>,int_const&>
               (QPromiseResolve<QVariant> *resolve,QPromiseReject<QVariant> *reject,
               function<QVariant_(const_int_&)> *fn,int *args)

{
  QVariant local_48;
  int *local_28;
  int *args_local;
  function<QVariant_(const_int_&)> *fn_local;
  QPromiseReject<QVariant> *reject_local;
  QPromiseResolve<QVariant> *resolve_local;
  
  local_28 = args;
  args_local = (int *)fn;
  fn_local = (function<QVariant_(const_int_&)> *)reject;
  reject_local = (QPromiseReject<QVariant> *)resolve;
  std::function<QVariant_(const_int_&)>::operator()(&local_48,fn,args);
  PromiseFulfill<QVariant>::
  call<QVariant,QtPromise::QPromiseResolve<QVariant>,QtPromise::QPromiseReject<QVariant>>
            (&local_48,(QPromiseResolve<QVariant> *)reject_local,
             (QPromiseReject<QVariant> *)fn_local);
  QVariant::~QVariant(&local_48);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }